

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O2

t_symbol * dogensym(char *s,t_symbol *oldsym,_pdinstance *pdinstance)

{
  t_symbol *ptVar1;
  int iVar2;
  char *__dest;
  uint uVar3;
  _symbol **pp_Var4;
  size_t nbytes;
  
  uVar3 = 0x1505;
  for (nbytes = 1; s[nbytes - 1] != '\0'; nbytes = nbytes + 1) {
    uVar3 = uVar3 * 0x21 + (int)s[nbytes - 1];
  }
  pp_Var4 = (_symbol **)((ulong)((uVar3 & 0x3fff) << 3) + (long)pd_maininstance.pd_symhash);
  while( true ) {
    ptVar1 = *pp_Var4;
    if (ptVar1 == (t_symbol *)0x0) {
      if (oldsym == (t_symbol *)0x0) {
        oldsym = (t_symbol *)getbytes(0x18);
      }
      __dest = (char *)getbytes(nbytes);
      oldsym->s_thing = (_class **)0x0;
      oldsym->s_next = (_symbol *)0x0;
      strcpy(__dest,s);
      oldsym->s_name = __dest;
      *pp_Var4 = oldsym;
      return oldsym;
    }
    iVar2 = strcmp(ptVar1->s_name,s);
    if (iVar2 == 0) break;
    pp_Var4 = &ptVar1->s_next;
  }
  return ptVar1;
}

Assistant:

static t_symbol *dogensym(const char *s, t_symbol *oldsym,
    t_pdinstance *pdinstance)
{
    char *symname = 0;
    t_symbol **symhashloc, *sym2;
    unsigned int hash = 5381;
    int length = 0;
    const char *s2 = s;
    while (*s2) /* djb2 hash algo */
    {
        hash = ((hash << 5) + hash) + *s2;
        length++;
        s2++;
    }
    symhashloc = pdinstance->pd_symhash + (hash & (SYMTABHASHSIZE-1));
    while ((sym2 = *symhashloc))
    {
        if (!strcmp(sym2->s_name, s))
            return(sym2);
        symhashloc = &sym2->s_next;
    }
    if (oldsym)
        sym2 = oldsym;
    else sym2 = (t_symbol *)t_getbytes(sizeof(*sym2));
    symname = t_getbytes(length+1);
    sym2->s_next = 0;
    sym2->s_thing = 0;
    strcpy(symname, s);
    sym2->s_name = symname;
    *symhashloc = sym2;
    return (sym2);
}